

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall
PieceSquareTableInterpolating::Append
          (PieceSquareTableInterpolating *this,PieceSquareRawTableType *table,
          float fInterpolationFactor)

{
  PieceSquareTableBase baseTable;
  float local_11c;
  value_type local_118;
  
  local_118._vptr_PieceSquareTableBase = (_func_int **)&PTR_InvertColor_00122590;
  local_11c = fInterpolationFactor;
  memcpy(&local_118.m_SourceTable,table,0x100);
  std::vector<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>::push_back
            (&this->m_SourceTables,&local_118);
  std::vector<float,_std::allocator<float>_>::push_back(&this->m_Phases,&local_11c);
  return;
}

Assistant:

void Append( const PieceSquareRawTableType &table,
                 const float fInterpolationFactor = 0.0f )
    {
        /* for now, we're order sensitive on this. */
        PieceSquareTableBase baseTable( table );
        m_SourceTables.push_back( baseTable );
        m_Phases.push_back( fInterpolationFactor );
    }